

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
MetadataTest_CopyMetadataToFrameBuffer_Test::TestBody
          (MetadataTest_CopyMetadataToFrameBuffer_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  aom_metadata_t *paVar3;
  AssertHelper *this_00;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  aom_metadata_array_t *metadata_array_2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int status;
  AssertionResult gtest_ar;
  aom_metadata_array_t *metadata_array;
  YV12_BUFFER_CONFIG yvBuf;
  size_t in_stack_fffffffffffffd78;
  aom_metadata_array_t *in_stack_fffffffffffffd80;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffd88;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  char *in_stack_fffffffffffffd98;
  int line;
  char *in_stack_fffffffffffffda0;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffdac;
  Type type;
  AssertHelper *in_stack_fffffffffffffdb0;
  Message *in_stack_fffffffffffffdf8;
  AssertionResult *this_03;
  AssertionResult local_1d8 [2];
  undefined4 local_1b4;
  AssertionResult local_1b0 [2];
  undefined8 local_190;
  AssertionResult local_188;
  aom_metadata_array_t *local_178;
  undefined4 local_15c;
  AssertionResult local_158 [2];
  undefined4 local_134;
  AssertionResult local_130;
  int local_120;
  uint local_11c;
  undefined8 local_f8;
  AssertionResult local_f0;
  aom_metadata_array_t *local_e0;
  undefined8 local_10;
  
  local_10 = 0;
  local_e0 = aom_img_metadata_array_alloc(in_stack_fffffffffffffd78);
  local_f8 = 0;
  this_03 = &local_f0;
  testing::internal::CmpHelperNE<aom_metadata_array*,decltype(nullptr)>
            (in_stack_fffffffffffffd98,
             (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             (aom_metadata_array **)in_stack_fffffffffffffd88,(void **)in_stack_fffffffffffffd80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffdf8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0xbad989);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
    testing::Message::~Message((Message *)0xbad9ec);
  }
  local_11c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbada5a);
  if (local_11c == 0) {
    paVar3 = aom_img_metadata_alloc
                       ((uint32_t)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                        (uint8_t *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                        (size_t)in_stack_fffffffffffffd88,
                        (aom_metadata_insert_flags_t)((ulong)in_stack_fffffffffffffd80 >> 0x20));
    *local_e0->metadata_array = paVar3;
    local_120 = aom_copy_metadata_to_frame_buffer
                          (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    local_134 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffd98,
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (int *)in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
      testing::AssertionResult::failure_message((AssertionResult *)0xbadb56);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                 (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
      testing::Message::~Message((Message *)0xbadbb3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbadc08);
    local_120 = aom_copy_metadata_to_frame_buffer
                          (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    local_15c = 0xffffffff;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffd98,
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (int *)in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
      testing::AssertionResult::failure_message((AssertionResult *)0xbadcc1);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                 (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
      testing::Message::~Message((Message *)0xbadd1e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbadd76);
    aom_img_metadata_array_free(in_stack_fffffffffffffd80);
    local_178 = aom_img_metadata_array_alloc(in_stack_fffffffffffffd78);
    local_190 = 0;
    testing::internal::CmpHelperNE<aom_metadata_array*,decltype(nullptr)>
              (in_stack_fffffffffffffd98,
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (aom_metadata_array **)in_stack_fffffffffffffd88,(void **)in_stack_fffffffffffffd80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffdb0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbade36);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                 (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
      testing::Message::~Message((Message *)0xbade93);
    }
    local_11c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbadf01);
    if (local_11c == 0) {
      local_120 = aom_copy_metadata_to_frame_buffer
                            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      local_1b4 = 0xffffffff;
      this_02 = local_1b0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffd98,
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 (int *)in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
      type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdac);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
        in_stack_fffffffffffffd98 =
             testing::AssertionResult::failure_message((AssertionResult *)0xbadfd0);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdb0,type,&this_02->success_,
                   (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
        testing::Message::~Message((Message *)0xbae02d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbae085);
      aom_img_metadata_array_free(in_stack_fffffffffffffd80);
      local_120 = aom_copy_metadata_to_frame_buffer
                            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      this_01 = local_1d8;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffd98,
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 (int *)this_01,(int *)in_stack_fffffffffffffd80);
      line = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
      uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
      if (!(bool)uVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xbae14b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdb0,type,&this_02->success_,line,
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffffd90));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xbae1a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbae1fd);
      aom_remove_metadata_from_frame_buffer((YV12_BUFFER_CONFIG *)0xbae20a);
      aom_remove_metadata_from_frame_buffer((YV12_BUFFER_CONFIG *)0xbae213);
    }
  }
  return;
}

Assistant:

TEST(MetadataTest, CopyMetadataToFrameBuffer) {
  YV12_BUFFER_CONFIG yvBuf;
  yvBuf.metadata = nullptr;

  aom_metadata_array_t *metadata_array = aom_img_metadata_array_alloc(1);
  ASSERT_NE(metadata_array, nullptr);

  metadata_array->metadata_array[0] =
      aom_img_metadata_alloc(OBU_METADATA_TYPE_ITUT_T35, kMetadataPayloadT35,
                             kMetadataPayloadSizeT35, AOM_MIF_ANY_FRAME);

  // Metadata_array
  int status = aom_copy_metadata_to_frame_buffer(&yvBuf, metadata_array);
  EXPECT_EQ(status, 0);
  status = aom_copy_metadata_to_frame_buffer(nullptr, metadata_array);
  EXPECT_EQ(status, -1);
  aom_img_metadata_array_free(metadata_array);

  // Metadata_array_2
  aom_metadata_array_t *metadata_array_2 = aom_img_metadata_array_alloc(0);
  ASSERT_NE(metadata_array_2, nullptr);
  status = aom_copy_metadata_to_frame_buffer(&yvBuf, metadata_array_2);
  EXPECT_EQ(status, -1);
  aom_img_metadata_array_free(metadata_array_2);

  // YV12_BUFFER_CONFIG
  status = aom_copy_metadata_to_frame_buffer(&yvBuf, nullptr);
  EXPECT_EQ(status, -1);
  aom_remove_metadata_from_frame_buffer(&yvBuf);
  aom_remove_metadata_from_frame_buffer(nullptr);
}